

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filefind.cpp
# Opt level: O2

void __thiscall Am_Filename::Am_Filename(Am_Filename *this,Am_Filename *dir,Am_Filename *name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  if (((name->filename)._M_string_length != 0) && (*(name->filename)._M_dataplus._M_p != '/')) {
    std::operator+(&bStack_38,&dir->filename,"/");
    std::operator+(&this->filename,&bStack_38,&name->filename);
    std::__cxx11::string::~string((string *)&bStack_38);
    return;
  }
  std::__cxx11::string::string((string *)this,(string *)name);
  return;
}

Assistant:

Am_Filename::Am_Filename(const Am_Filename &dir, const Am_Filename &name)
    : filename(name.Is_Relative() ? dir.filename + "/" + name.filename
                                  : name.filename) // UNIX-specific
{
}